

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int frame_might_allow_ref_frame_mvs(AV1_COMMON *cm)

{
  int iVar1;
  AV1_COMMON *in_RDI;
  byte local_9;
  
  local_9 = 0;
  if (((((in_RDI->features).error_resilient_mode & 1U) == 0) &&
      (local_9 = 0, (in_RDI->seq_params->order_hint_info).enable_ref_frame_mvs != 0)) &&
     (local_9 = 0, (in_RDI->seq_params->order_hint_info).enable_order_hint != 0)) {
    iVar1 = frame_is_intra_only(in_RDI);
    local_9 = iVar1 != 0 ^ 0xff;
  }
  return (int)(local_9 & 1);
}

Assistant:

static inline int frame_might_allow_ref_frame_mvs(const AV1_COMMON *cm) {
  return !cm->features.error_resilient_mode &&
         cm->seq_params->order_hint_info.enable_ref_frame_mvs &&
         cm->seq_params->order_hint_info.enable_order_hint &&
         !frame_is_intra_only(cm);
}